

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNArglistBase::fold_constants(CTPNArglistBase *this,CTcPrsSymtab *symtab)

{
  CTPNArglistBase *pCVar1;
  
  pCVar1 = this;
  while (pCVar1 = (CTPNArglistBase *)pCVar1->list_, pCVar1 != (CTPNArglistBase *)0x0) {
    (*(((CTPNArgBase *)&pCVar1->super_CTcPrsNode)->super_CTcPrsNode).super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0xf])(pCVar1,symtab);
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNArglistBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold each list element */
    CTPNArg *cur;
    for (cur = get_arg_list_head() ; cur != 0 ; cur = cur->get_next_arg())
        cur->fold_constants(symtab);

    /* return myself with no further folding */
    return this;
}